

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void tcg_func_start_riscv32(TCGContext_conflict9 *s)

{
  TCGPool *pTVar1;
  TCGPool *mem;
  
  mem = s->pool_first_large;
  while (mem != (TCGPool *)0x0) {
    pTVar1 = mem->next;
    g_free(mem);
    mem = pTVar1;
  }
  s->pool_cur = (uint8_t *)0x0;
  s->pool_end = (uint8_t *)0x0;
  s->pool_current = (TCGPool *)0x0;
  s->pool_first_large = (TCGPool *)0x0;
  s->nb_temps = s->nb_globals;
  memset(s->free_temps,0,0x280);
  s->nb_ops = 0;
  s->nb_labels = 0;
  s->current_frame_offset = s->frame_start;
  (s->ops).tqh_first = (TCGOp *)0x0;
  (s->ops).tqh_circ.tql_prev = (QTailQLink *)&s->ops;
  (s->free_ops).tqh_first = (TCGOp *)0x0;
  (s->free_ops).tqh_circ.tql_prev = (QTailQLink *)&s->free_ops;
  (s->labels).sqh_first = (TCGLabel *)0x0;
  (s->labels).sqh_last = &(s->labels).sqh_first;
  return;
}

Assistant:

void tcg_func_start(TCGContext *s)
{
    tcg_pool_reset(s);
    s->nb_temps = s->nb_globals;

    /* No temps have been previously allocated for size or locality.  */
    memset(s->free_temps, 0, sizeof(s->free_temps));

    s->nb_ops = 0;
    s->nb_labels = 0;
    s->current_frame_offset = s->frame_start;

#ifdef CONFIG_DEBUG_TCG
    s->goto_tb_issue_mask = 0;
#endif

    QTAILQ_INIT(&s->ops);
    QTAILQ_INIT(&s->free_ops);
    QSIMPLEQ_INIT(&s->labels);
}